

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags flags)

{
  bool bVar1;
  byte bVar2;
  uint in_ESI;
  uint in_EDI;
  bool is_open;
  char name [20];
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000334;
  bool *in_stack_00000338;
  char *in_stack_00000340;
  ImGuiID in_stack_ffffffffffffffc4;
  char local_38 [32];
  ImGuiContext *local_18;
  uint local_c;
  uint local_8;
  bool local_1;
  
  local_18 = GImGui;
  local_c = in_ESI;
  local_8 = in_EDI;
  bVar1 = IsPopupOpen(in_stack_ffffffffffffffc4);
  if (bVar1) {
    if ((local_c & 0x10000000) == 0) {
      ImFormatString(local_38,0x14,"##Popup_%08x",(ulong)local_8);
    }
    else {
      ImFormatString(local_38,0x14,"##Menu_%02d",(ulong)(uint)(local_18->BeginPopupStack).Size);
    }
    local_c = local_c | 0x4000000;
    bVar2 = Begin(in_stack_00000340,in_stack_00000338,in_stack_00000334);
    if (!(bool)bVar2) {
      EndPopup();
    }
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    ImGuiNextWindowData::ClearFlags(&local_18->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    flags |= ImGuiWindowFlags_Popup;
    bool is_open = Begin(name, NULL, flags);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}